

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnReturnCall(SharedValidator *this,Location *loc,Var *func_var)

{
  Result rhs;
  Var local_b8;
  Enum local_6c;
  undefined1 local_68 [8];
  FuncType func_type;
  Var *func_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&func_type.field_0x34,ReturnCall);
  this_local._4_4_ = CheckInstr(this,(Opcode)func_type._52_4_,loc);
  FuncType::FuncType((FuncType *)local_68);
  Var::Var(&local_b8,func_var);
  local_6c = (Enum)CheckFuncIndex(this,&local_b8,(FuncType *)local_68);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_6c);
  Var::~Var(&local_b8);
  rhs = TypeChecker::OnReturnCall
                  (&this->typechecker_,(TypeVector *)local_68,
                   (TypeVector *)
                   &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  FuncType::~FuncType((FuncType *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnReturnCall(const Location& loc, Var func_var) {
  Result result = CheckInstr(Opcode::ReturnCall, loc);
  FuncType func_type;
  result |= CheckFuncIndex(func_var, &func_type);
  result |= typechecker_.OnReturnCall(func_type.params, func_type.results);
  return result;
}